

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httprpc.cpp
# Opt level: O0

bool multiUserAuthorized(string *strUserPass)

{
  Span<const_unsigned_char> s;
  bool bVar1;
  size_type sVar2;
  CHMAC_SHA256 *__a;
  size_t in_RDI;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vFields;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hexvec;
  iterator __end1;
  iterator __begin1;
  string strHashFromPass;
  uchar out [32];
  string strHash;
  string strSalt;
  string strName;
  string strPass;
  string strUser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  uint in_stack_fffffffffffffd7c;
  CHMAC_SHA256 *in_stack_fffffffffffffd80;
  size_type in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 uVar3;
  uint local_22c;
  uchar *in_stack_fffffffffffffdf0;
  byte local_1f9;
  undefined1 local_a8 [160];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (in_stack_fffffffffffffdb0,(char)((uint)in_stack_fffffffffffffdbc >> 0x18),
                     (size_type)in_stack_fffffffffffffda8);
  if (sVar2 == 0xffffffffffffffff) {
    local_1f9 = 0;
  }
  else {
    uVar3 = 0x3a;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
              (in_stack_fffffffffffffdb0,'\0',(size_type)in_stack_fffffffffffffda8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (size_type)in_stack_fffffffffffffd80);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
              (in_stack_fffffffffffffdb0,(char)((uint)uVar3 >> 0x18),
               (size_type)in_stack_fffffffffffffda8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (size_type)in_stack_fffffffffffffd80);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::begin(in_stack_fffffffffffffd70);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::end(in_stack_fffffffffffffd70);
    while (bVar1 = __gnu_cxx::
                   operator==<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                             ((__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                              (__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_fffffffffffffd70), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::operator*((__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)in_stack_fffffffffffffd68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   (size_type)in_stack_fffffffffffffd70);
      std::__cxx11::string::string(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      bVar1 = TimingResistantEqual<std::__cxx11::string>
                        (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     (size_type)in_stack_fffffffffffffd70);
        std::__cxx11::string::string(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     (size_type)in_stack_fffffffffffffd70);
        std::__cxx11::string::string(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        in_stack_fffffffffffffda8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x20);
        in_stack_fffffffffffffdb0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (in_stack_fffffffffffffd68);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                  (in_stack_fffffffffffffd68);
        CHMAC_SHA256::CHMAC_SHA256
                  (in_stack_fffffffffffffd80,
                   (uchar *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   (size_t)in_stack_fffffffffffffd70);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                  (in_stack_fffffffffffffd68);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                  (in_stack_fffffffffffffd68);
        __a = CHMAC_SHA256::Write((CHMAC_SHA256 *)
                                  CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                                  (uchar *)in_stack_fffffffffffffd70,
                                  (size_t)in_stack_fffffffffffffd68);
        CHMAC_SHA256::Finalize
                  ((CHMAC_SHA256 *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   (uchar *)in_stack_fffffffffffffd70);
        in_stack_fffffffffffffd80 = (CHMAC_SHA256 *)local_a8;
        std::allocator<unsigned_char>::allocator
                  ((allocator<unsigned_char> *)in_stack_fffffffffffffd68);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffdb0,(uchar *)CONCAT44(uVar3,in_stack_fffffffffffffdb8),
                   (uchar *)in_stack_fffffffffffffda8,(allocator_type *)__a);
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)in_stack_fffffffffffffd68);
        Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<const_unsigned_char> *)
                   CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        s.m_size = in_RDI;
        s.m_data = in_stack_fffffffffffffdf0;
        HexStr_abi_cxx11_(s);
        bVar1 = TimingResistantEqual<std::__cxx11::string>
                          (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        if (bVar1) {
          local_1f9 = 1;
        }
        local_22c = (uint)bVar1;
        std::__cxx11::string::~string(in_stack_fffffffffffffd68);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        std::__cxx11::string::~string(in_stack_fffffffffffffd68);
        std::__cxx11::string::~string(in_stack_fffffffffffffd68);
      }
      else {
        local_22c = 3;
      }
      std::__cxx11::string::~string(in_stack_fffffffffffffd68);
      if ((local_22c != 0) && (local_22c != 3)) goto LAB_008e9d52;
      __gnu_cxx::
      __normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::operator++((__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_fffffffffffffd68);
      in_stack_fffffffffffffd7c = local_22c;
    }
    local_1f9 = 0;
LAB_008e9d52:
    std::__cxx11::string::~string(in_stack_fffffffffffffd68);
    std::__cxx11::string::~string(in_stack_fffffffffffffd68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_1f9 & 1);
}

Assistant:

static bool multiUserAuthorized(std::string strUserPass)
{
    if (strUserPass.find(':') == std::string::npos) {
        return false;
    }
    std::string strUser = strUserPass.substr(0, strUserPass.find(':'));
    std::string strPass = strUserPass.substr(strUserPass.find(':') + 1);

    for (const auto& vFields : g_rpcauth) {
        std::string strName = vFields[0];
        if (!TimingResistantEqual(strName, strUser)) {
            continue;
        }

        std::string strSalt = vFields[1];
        std::string strHash = vFields[2];

        static const unsigned int KEY_SIZE = 32;
        unsigned char out[KEY_SIZE];

        CHMAC_SHA256(reinterpret_cast<const unsigned char*>(strSalt.data()), strSalt.size()).Write(reinterpret_cast<const unsigned char*>(strPass.data()), strPass.size()).Finalize(out);
        std::vector<unsigned char> hexvec(out, out+KEY_SIZE);
        std::string strHashFromPass = HexStr(hexvec);

        if (TimingResistantEqual(strHashFromPass, strHash)) {
            return true;
        }
    }
    return false;
}